

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O0

int ACTION_SCORE::score_comp(void *p1,void *p2)

{
  uint *in_RSI;
  uint *in_RDI;
  action_score *s2;
  action_score *s1;
  int local_4;
  
  if (((float)in_RSI[1] != (float)in_RDI[1]) || (NAN((float)in_RSI[1]) || NAN((float)in_RDI[1]))) {
    if ((float)in_RSI[1] < (float)in_RDI[1]) {
      local_4 = 1;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = cmp((void *)(ulong)*in_RDI,(void *)(ulong)*in_RSI);
  }
  return local_4;
}

Assistant:

inline int score_comp(const void* p1, const void* p2)
{
  action_score* s1 = (action_score*)p1;
  action_score* s2 = (action_score*)p2;
  // Most sorting algos do not guarantee the output order of elements that compare equal.
  // Tie-breaking on the index ensures that the result is deterministic across platforms.
  // However, this forces a strict ordering, rather than a weak ordering, which carries a performance cost.
  if (s2->score == s1->score)
    return cmp(s1->action, s2->action);
  else if (s2->score >= s1->score)
    return -1;
  else
    return 1;
}